

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

PmError pm_linuxalsa_init(void)

{
  undefined8 uVar1;
  PmError PVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  void *__s;
  undefined8 uStack_40;
  void *local_38;
  
  uStack_40 = 0x10495b;
  PVar2 = snd_seq_open(&seq,"default",3,0);
  if (~pmNoData < PVar2) {
    uStack_40 = 0x104968;
    lVar7 = snd_seq_client_info_sizeof();
    lVar7 = -(lVar7 + 0xfU & 0xfffffffffffffff0);
    pvVar10 = (void *)((long)&local_38 + lVar7);
    *(undefined8 *)((long)&uStack_40 + lVar7) = 0x10497e;
    sVar8 = snd_seq_client_info_sizeof();
    *(undefined8 *)((long)&uStack_40 + lVar7) = 0x10498b;
    memset(pvVar10,0,sVar8);
    *(undefined8 *)((long)&uStack_40 + lVar7) = 0x104990;
    lVar7 = snd_seq_port_info_sizeof();
    __s = (void *)((long)pvVar10 - (lVar7 + 0xfU & 0xfffffffffffffff0));
    *(undefined8 *)((long)__s + -8) = 0x1049a6;
    sVar8 = snd_seq_port_info_sizeof();
    *(undefined8 *)((long)__s + -8) = 0x1049b3;
    memset(__s,0,sVar8);
    *(undefined8 *)((long)__s + -8) = 0xffffffffffffffff;
    uVar1 = *(undefined8 *)((long)__s + -8);
    local_38 = pvVar10;
    *(undefined8 *)((long)__s + -8) = 0x1049c2;
    snd_seq_client_info_set_client(pvVar10,uVar1);
    while( true ) {
      pvVar10 = local_38;
      *(undefined8 *)((long)__s + -8) = 0x1049dc;
      iVar3 = snd_seq_query_next_client(seq,pvVar10);
      if (iVar3 != 0) break;
      *(undefined8 *)((long)__s + -8) = 0x1049ec;
      uVar4 = snd_seq_client_info_get_client(pvVar10);
      *(undefined8 *)((long)__s + -8) = 0x1049f6;
      snd_seq_port_info_set_client(__s,uVar4);
      *(undefined8 *)((long)__s + -8) = 0xffffffffffffffff;
      uVar1 = *(undefined8 *)((long)__s + -8);
      *(undefined8 *)((long)__s + -8) = 0x104a01;
      snd_seq_port_info_set_port(__s,uVar1);
      while( true ) {
        *(undefined8 *)((long)__s + -8) = 0x104a10;
        iVar3 = snd_seq_query_next_port(seq,__s);
        if (iVar3 != 0) break;
        *(undefined8 *)((long)__s + -8) = 0x104a1c;
        iVar3 = snd_seq_port_info_get_client(__s);
        if (iVar3 != 0) {
          *(undefined8 *)((long)__s + -8) = 0x104a28;
          uVar5 = snd_seq_port_info_get_capability(__s);
          if ((uVar5 & 0x60) != 0) {
            if ((uVar5 & 0x40) != 0) {
              if (pm_default_output_device_id == -1) {
                pm_default_output_device_id = pm_descriptor_index;
              }
              *(undefined8 *)((long)__s + -8) = 0x104a5a;
              pcVar9 = (char *)snd_seq_port_info_get_name(__s);
              *(undefined8 *)((long)__s + -8) = 0x104a62;
              pcVar9 = pm_strdup(pcVar9);
              *(undefined8 *)((long)__s + -8) = 0x104a6d;
              iVar3 = snd_seq_port_info_get_client(__s);
              *(undefined8 *)((long)__s + -8) = 0x104a7c;
              iVar6 = snd_seq_port_info_get_port(__s);
              *(undefined8 *)((long)__s + -8) = 0x104a96;
              pm_add_device("ALSA",pcVar9,0,(void *)((long)iVar6 | (long)iVar3 << 8),
                            &pm_linuxalsa_out_dictionary);
            }
            if ((uVar5 & 0x20) != 0) {
              if (pm_default_input_device_id == -1) {
                pm_default_input_device_id = pm_descriptor_index;
              }
              *(undefined8 *)((long)__s + -8) = 0x104ac5;
              pcVar9 = (char *)snd_seq_port_info_get_name(__s);
              *(undefined8 *)((long)__s + -8) = 0x104acd;
              pcVar9 = pm_strdup(pcVar9);
              *(undefined8 *)((long)__s + -8) = 0x104ad8;
              iVar3 = snd_seq_port_info_get_client(__s);
              *(undefined8 *)((long)__s + -8) = 0x104ae7;
              iVar6 = snd_seq_port_info_get_port(__s);
              *(undefined8 *)((long)__s + -8) = 1;
              uVar1 = *(undefined8 *)((long)__s + -8);
              *(undefined8 *)((long)__s + -8) = 0x104b02;
              pm_add_device("ALSA",pcVar9,(int)uVar1,(void *)((long)iVar6 | (long)iVar3 << 8),
                            &pm_linuxalsa_in_dictionary);
            }
          }
        }
      }
    }
    PVar2 = pmNoData;
  }
  return PVar2;
}

Assistant:

PmError pm_linuxalsa_init( void )
{
    int  err;
    snd_seq_client_info_t *cinfo;
    snd_seq_port_info_t *pinfo;
    unsigned int caps;

    /* Previously, the last parameter was SND_SEQ_NONBLOCK, but this 
     * would cause messages to be dropped if the ALSA buffer fills up.
     * The correct behavior is for writes to block until there is 
     * room to send all the data. The client should normally allocate
     * a large enough buffer to avoid blocking on output. 
     * Now that blocking is enabled, the seq_event_input() will block
     * if there is no input data. This is not what we want, so must
     * call seq_event_input_pending() to avoid blocking.
     */
    err = snd_seq_open(&seq, "default", SND_SEQ_OPEN_DUPLEX, 0);
    if (err < 0) return err;
    
    snd_seq_client_info_alloca(&cinfo);
    snd_seq_port_info_alloca(&pinfo);

    snd_seq_client_info_set_client(cinfo, -1);
    while (snd_seq_query_next_client(seq, cinfo) == 0) {
        snd_seq_port_info_set_client(pinfo, snd_seq_client_info_get_client(cinfo));
        snd_seq_port_info_set_port(pinfo, -1);
        while (snd_seq_query_next_port(seq, pinfo) == 0) {
            if (snd_seq_port_info_get_client(pinfo) == SND_SEQ_CLIENT_SYSTEM)
                continue; /* ignore Timer and Announce ports on client 0 */
            caps = snd_seq_port_info_get_capability(pinfo);
            if (!(caps & (SND_SEQ_PORT_CAP_SUBS_READ | SND_SEQ_PORT_CAP_SUBS_WRITE)))
                continue; /* ignore if you cannot read or write port */
            if (caps & SND_SEQ_PORT_CAP_SUBS_WRITE) {
                if (pm_default_output_device_id == -1)
                    pm_default_output_device_id = pm_descriptor_index;
                pm_add_device("ALSA",
                              pm_strdup(snd_seq_port_info_get_name(pinfo)),
                              FALSE,
                              MAKE_DESCRIPTOR((uintptr_t)snd_seq_port_info_get_client(pinfo),
                                              snd_seq_port_info_get_port(pinfo)),
                              &pm_linuxalsa_out_dictionary);
            }
            if (caps & SND_SEQ_PORT_CAP_SUBS_READ) {
                if (pm_default_input_device_id == -1)
                    pm_default_input_device_id = pm_descriptor_index;
                pm_add_device("ALSA",
                              pm_strdup(snd_seq_port_info_get_name(pinfo)),
                              TRUE,
                              MAKE_DESCRIPTOR((uintptr_t)snd_seq_port_info_get_client(pinfo),
                                              snd_seq_port_info_get_port(pinfo)),
                              &pm_linuxalsa_in_dictionary);
            }
        }
    }
    return pmNoError;
}